

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

bool __thiscall PArray::ReadValue(PArray *this,FArchive *ar,void *addr)

{
  DWORD DVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  BYTE tag_1;
  BYTE tag;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  FArchive::operator<<(ar,(BYTE *)((long)&uStack_38 + 7));
  if (uStack_38._7_1_ == 0xf) {
    DVar1 = FArchive::ReadCount(ar);
    uVar4 = this->ElementCount;
    uVar6 = uVar4;
    if (DVar1 < uVar4) {
      uVar6 = DVar1;
    }
    if (uVar6 == 0) {
      bVar5 = 0;
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      bVar5 = 0;
      do {
        iVar2 = (*(this->ElementType->super_DObject)._vptr_DObject[8])(this->ElementType,ar,addr);
        bVar5 = bVar5 | (byte)iVar2;
        uVar4 = this->ElementCount;
        addr = (void *)((long)addr + (ulong)this->ElementSize);
        uVar6 = uVar6 + 1;
        uVar3 = uVar4;
        if (DVar1 < uVar4) {
          uVar3 = DVar1;
        }
      } while (uVar6 < uVar3);
    }
    if ((uVar6 < uVar4) &&
       (DPrintf(2,"Array on disk (%u) is bigger than in memory (%u)\n",(ulong)DVar1),
       uVar6 < this->ElementCount)) {
      do {
        FArchive::operator<<(ar,(BYTE *)((long)&uStack_38 + 6));
        PType::SkipValue(ar,(uint)uStack_38._6_1_);
        uVar6 = uVar6 + 1;
      } while (uVar6 < this->ElementCount);
    }
  }
  else {
    PType::SkipValue(ar,(uint)uStack_38._7_1_);
    bVar5 = 0;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool PArray::ReadValue(FArchive &ar, void *addr) const
{
	bool readsomething = false;
	BYTE tag;

	ar << tag;
	if (tag == VAL_Array)
	{
		unsigned count = ar.ReadCount();
		unsigned i;
		BYTE *addrb = (BYTE *)addr;
		for (i = 0; i < MIN(count, ElementCount); ++i)
		{
			readsomething |= ElementType->ReadValue(ar, addrb);
			addrb += ElementSize;
		}
		if (i < ElementCount)
		{
			DPrintf(DMSG_WARNING, "Array on disk (%u) is bigger than in memory (%u)\n",
				count, ElementCount);
			for (; i < ElementCount; ++i)
			{
				SkipValue(ar);
			}
		}
		return readsomething;
	}
	SkipValue(ar, tag);
	return false;
}